

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zcc_expr.cpp
# Opt level: O0

void ZCC_InitOperators(void)

{
  int iVar1;
  ulong local_58;
  size_t i_1;
  __50 local_48;
  __49 local_47;
  __48 local_46;
  __47 local_45;
  __46 local_44;
  __45 local_43;
  __44 local_42;
  __43 local_41;
  __42 local_40;
  __41 local_3f;
  __40 local_3e;
  __39 local_3d;
  __38 local_3c;
  __37 local_3b;
  __36 local_3a;
  __35 local_39;
  __34 local_38;
  __33 local_37;
  __32 local_36;
  __31 local_35;
  __30 local_34;
  __29 local_33;
  __28 local_32;
  __27 local_31;
  __26 local_30;
  __25 local_2f;
  __24 local_2e;
  __23 local_2d;
  __22 local_2c;
  __21 local_2b;
  __20 local_2a;
  __19 local_29;
  __18 local_28;
  __17 local_27;
  __16 local_26;
  __15 local_25;
  __14 local_24;
  __13 local_23;
  __12 local_22;
  __11 local_21;
  ulong local_20;
  size_t i;
  __7 local_10;
  __6 local_f;
  __5 local_e;
  __4 local_d;
  __3 local_c;
  __2 local_b;
  __1 local_a;
  __0 local_9;
  
  if (ZCC_InitOperators()::UnaryOpInit == '\0') {
    iVar1 = __cxa_guard_acquire(&ZCC_InitOperators()::UnaryOpInit);
    if (iVar1 != 0) {
      ZCC_InitOperators::UnaryOpInit[0].Op = PEX_PostInc;
      ZCC_InitOperators::UnaryOpInit[0].Type = (PType **)&TypeSInt32;
      ZCC_InitOperators::UnaryOpInit[0].EvalConst = EvalIdentity;
      ZCC_InitOperators::UnaryOpInit[1].Op = PEX_PostInc;
      ZCC_InitOperators::UnaryOpInit[1].Type = (PType **)&TypeUInt32;
      ZCC_InitOperators::UnaryOpInit[1].EvalConst = EvalIdentity;
      ZCC_InitOperators::UnaryOpInit[2].Op = PEX_PostInc;
      ZCC_InitOperators::UnaryOpInit[2].Type = (PType **)&TypeFloat64;
      ZCC_InitOperators::UnaryOpInit[2].EvalConst = EvalIdentity;
      ZCC_InitOperators::UnaryOpInit[3].Op = PEX_PostDec;
      ZCC_InitOperators::UnaryOpInit[3].Type = (PType **)&TypeSInt32;
      ZCC_InitOperators::UnaryOpInit[3].EvalConst = EvalIdentity;
      ZCC_InitOperators::UnaryOpInit[4].Op = PEX_PostDec;
      ZCC_InitOperators::UnaryOpInit[4].Type = (PType **)&TypeUInt32;
      ZCC_InitOperators::UnaryOpInit[4].EvalConst = EvalIdentity;
      ZCC_InitOperators::UnaryOpInit[5].Op = PEX_PostDec;
      ZCC_InitOperators::UnaryOpInit[5].Type = (PType **)&TypeFloat64;
      ZCC_InitOperators::UnaryOpInit[5].EvalConst = EvalIdentity;
      ZCC_InitOperators::UnaryOpInit[6].Op = PEX_PreInc;
      ZCC_InitOperators::UnaryOpInit[6].Type = (PType **)&TypeSInt32;
      ZCC_InitOperators::UnaryOpInit[6].EvalConst =
           ZCC_InitOperators()::$_0::operator_cast_to_function_pointer(&local_9);
      ZCC_InitOperators::UnaryOpInit[7].Op = PEX_PreInc;
      ZCC_InitOperators::UnaryOpInit[7].Type = (PType **)&TypeUInt32;
      ZCC_InitOperators::UnaryOpInit[7].EvalConst =
           ZCC_InitOperators()::$_1::operator_cast_to_function_pointer(&local_a);
      ZCC_InitOperators::UnaryOpInit[8].Op = PEX_PreInc;
      ZCC_InitOperators::UnaryOpInit[8].Type = (PType **)&TypeFloat64;
      ZCC_InitOperators::UnaryOpInit[8].EvalConst =
           ZCC_InitOperators()::$_2::operator_cast_to_function_pointer(&local_b);
      ZCC_InitOperators::UnaryOpInit[9].Op = PEX_PreDec;
      ZCC_InitOperators::UnaryOpInit[9].Type = (PType **)&TypeSInt32;
      ZCC_InitOperators::UnaryOpInit[9].EvalConst =
           ZCC_InitOperators()::$_3::operator_cast_to_function_pointer(&local_c);
      ZCC_InitOperators::UnaryOpInit[10].Op = PEX_PreDec;
      ZCC_InitOperators::UnaryOpInit[10].Type = (PType **)&TypeUInt32;
      ZCC_InitOperators::UnaryOpInit[10].EvalConst =
           ZCC_InitOperators()::$_4::operator_cast_to_function_pointer(&local_d);
      ZCC_InitOperators::UnaryOpInit[0xb].Op = PEX_PreDec;
      ZCC_InitOperators::UnaryOpInit[0xb].Type = (PType **)&TypeFloat64;
      ZCC_InitOperators::UnaryOpInit[0xb].EvalConst =
           ZCC_InitOperators()::$_5::operator_cast_to_function_pointer(&local_e);
      ZCC_InitOperators::UnaryOpInit[0xc].Op = PEX_Negate;
      ZCC_InitOperators::UnaryOpInit[0xc].Type = (PType **)&TypeSInt32;
      ZCC_InitOperators::UnaryOpInit[0xc].EvalConst =
           ZCC_InitOperators()::$_6::operator_cast_to_function_pointer(&local_f);
      ZCC_InitOperators::UnaryOpInit[0xd].Op = PEX_Negate;
      ZCC_InitOperators::UnaryOpInit[0xd].Type = (PType **)&TypeFloat64;
      ZCC_InitOperators::UnaryOpInit[0xd].EvalConst =
           ZCC_InitOperators()::$_7::operator_cast_to_function_pointer(&local_10);
      ZCC_InitOperators::UnaryOpInit[0xe].Op = PEX_AntiNegate;
      ZCC_InitOperators::UnaryOpInit[0xe].Type = (PType **)&TypeSInt32;
      ZCC_InitOperators::UnaryOpInit[0xe].EvalConst = EvalIdentity;
      ZCC_InitOperators::UnaryOpInit[0xf].Op = PEX_AntiNegate;
      ZCC_InitOperators::UnaryOpInit[0xf].Type = (PType **)&TypeUInt32;
      ZCC_InitOperators::UnaryOpInit[0xf].EvalConst = EvalIdentity;
      ZCC_InitOperators::UnaryOpInit[0x10].Op = PEX_AntiNegate;
      ZCC_InitOperators::UnaryOpInit[0x10].Type = (PType **)&TypeFloat64;
      ZCC_InitOperators::UnaryOpInit[0x10].EvalConst = EvalIdentity;
      ZCC_InitOperators::UnaryOpInit[0x11].Op = PEX_BitNot;
      ZCC_InitOperators::UnaryOpInit[0x11].Type = (PType **)&TypeSInt32;
      ZCC_InitOperators::UnaryOpInit[0x11].EvalConst =
           ZCC_InitOperators()::$_8::operator_cast_to_function_pointer((__8 *)((long)&i + 7));
      ZCC_InitOperators::UnaryOpInit[0x12].Op = PEX_BitNot;
      ZCC_InitOperators::UnaryOpInit[0x12].Type = (PType **)&TypeUInt32;
      ZCC_InitOperators::UnaryOpInit[0x12].EvalConst =
           ZCC_InitOperators()::$_9::operator_cast_to_function_pointer((__9 *)((long)&i + 6));
      ZCC_InitOperators::UnaryOpInit[0x13].Op = PEX_BoolNot;
      ZCC_InitOperators::UnaryOpInit[0x13].Type = (PType **)&TypeBool;
      ZCC_InitOperators::UnaryOpInit[0x13].EvalConst =
           ZCC_InitOperators()::$_10::operator_cast_to_function_pointer((__10 *)((long)&i + 5));
      __cxa_guard_release(&ZCC_InitOperators()::UnaryOpInit);
    }
  }
  for (local_20 = 0; local_20 < 0x14; local_20 = local_20 + 1) {
    ZCC_OpInfoType::AddProto
              (ZCC_OpInfo + ZCC_InitOperators::UnaryOpInit[local_20].Op,
               *ZCC_InitOperators::UnaryOpInit[local_20].Type,
               *ZCC_InitOperators::UnaryOpInit[local_20].Type,
               ZCC_InitOperators::UnaryOpInit[local_20].EvalConst);
  }
  if (ZCC_InitOperators()::BinaryOpInit == '\0') {
    iVar1 = __cxa_guard_acquire(&ZCC_InitOperators()::BinaryOpInit);
    if (iVar1 != 0) {
      ZCC_InitOperators::BinaryOpInit[0].Op = PEX_Add;
      ZCC_InitOperators::BinaryOpInit[0].Res = (PType **)&TypeSInt32;
      ZCC_InitOperators::BinaryOpInit[0].Ltype = (PType **)&TypeSInt32;
      ZCC_InitOperators::BinaryOpInit[0].Rtype = (PType **)&TypeSInt32;
      ZCC_InitOperators::BinaryOpInit[0].EvalConst =
           ZCC_InitOperators()::$_11::operator_cast_to_function_pointer(&local_21);
      ZCC_InitOperators::BinaryOpInit[1].Op = PEX_Add;
      ZCC_InitOperators::BinaryOpInit[1].Res = (PType **)&TypeUInt32;
      ZCC_InitOperators::BinaryOpInit[1].Ltype = (PType **)&TypeUInt32;
      ZCC_InitOperators::BinaryOpInit[1].Rtype = (PType **)&TypeUInt32;
      ZCC_InitOperators::BinaryOpInit[1].EvalConst =
           ZCC_InitOperators()::$_12::operator_cast_to_function_pointer(&local_22);
      ZCC_InitOperators::BinaryOpInit[2].Op = PEX_Add;
      ZCC_InitOperators::BinaryOpInit[2].Res = (PType **)&TypeFloat64;
      ZCC_InitOperators::BinaryOpInit[2].Ltype = (PType **)&TypeFloat64;
      ZCC_InitOperators::BinaryOpInit[2].Rtype = (PType **)&TypeFloat64;
      ZCC_InitOperators::BinaryOpInit[2].EvalConst =
           ZCC_InitOperators()::$_13::operator_cast_to_function_pointer(&local_23);
      ZCC_InitOperators::BinaryOpInit[3].Op = PEX_Sub;
      ZCC_InitOperators::BinaryOpInit[3].Res = (PType **)&TypeSInt32;
      ZCC_InitOperators::BinaryOpInit[3].Ltype = (PType **)&TypeSInt32;
      ZCC_InitOperators::BinaryOpInit[3].Rtype = (PType **)&TypeSInt32;
      ZCC_InitOperators::BinaryOpInit[3].EvalConst =
           ZCC_InitOperators()::$_14::operator_cast_to_function_pointer(&local_24);
      ZCC_InitOperators::BinaryOpInit[4].Op = PEX_Sub;
      ZCC_InitOperators::BinaryOpInit[4].Res = (PType **)&TypeUInt32;
      ZCC_InitOperators::BinaryOpInit[4].Ltype = (PType **)&TypeUInt32;
      ZCC_InitOperators::BinaryOpInit[4].Rtype = (PType **)&TypeUInt32;
      ZCC_InitOperators::BinaryOpInit[4].EvalConst =
           ZCC_InitOperators()::$_15::operator_cast_to_function_pointer(&local_25);
      ZCC_InitOperators::BinaryOpInit[5].Op = PEX_Sub;
      ZCC_InitOperators::BinaryOpInit[5].Res = (PType **)&TypeFloat64;
      ZCC_InitOperators::BinaryOpInit[5].Ltype = (PType **)&TypeFloat64;
      ZCC_InitOperators::BinaryOpInit[5].Rtype = (PType **)&TypeFloat64;
      ZCC_InitOperators::BinaryOpInit[5].EvalConst =
           ZCC_InitOperators()::$_16::operator_cast_to_function_pointer(&local_26);
      ZCC_InitOperators::BinaryOpInit[6].Op = PEX_Mul;
      ZCC_InitOperators::BinaryOpInit[6].Res = (PType **)&TypeSInt32;
      ZCC_InitOperators::BinaryOpInit[6].Ltype = (PType **)&TypeSInt32;
      ZCC_InitOperators::BinaryOpInit[6].Rtype = (PType **)&TypeSInt32;
      ZCC_InitOperators::BinaryOpInit[6].EvalConst =
           ZCC_InitOperators()::$_17::operator_cast_to_function_pointer(&local_27);
      ZCC_InitOperators::BinaryOpInit[7].Op = PEX_Mul;
      ZCC_InitOperators::BinaryOpInit[7].Res = (PType **)&TypeUInt32;
      ZCC_InitOperators::BinaryOpInit[7].Ltype = (PType **)&TypeUInt32;
      ZCC_InitOperators::BinaryOpInit[7].Rtype = (PType **)&TypeUInt32;
      ZCC_InitOperators::BinaryOpInit[7].EvalConst =
           ZCC_InitOperators()::$_18::operator_cast_to_function_pointer(&local_28);
      ZCC_InitOperators::BinaryOpInit[8].Op = PEX_Mul;
      ZCC_InitOperators::BinaryOpInit[8].Res = (PType **)&TypeFloat64;
      ZCC_InitOperators::BinaryOpInit[8].Ltype = (PType **)&TypeFloat64;
      ZCC_InitOperators::BinaryOpInit[8].Rtype = (PType **)&TypeFloat64;
      ZCC_InitOperators::BinaryOpInit[8].EvalConst =
           ZCC_InitOperators()::$_19::operator_cast_to_function_pointer(&local_29);
      ZCC_InitOperators::BinaryOpInit[9].Op = PEX_Div;
      ZCC_InitOperators::BinaryOpInit[9].Res = (PType **)&TypeSInt32;
      ZCC_InitOperators::BinaryOpInit[9].Ltype = (PType **)&TypeSInt32;
      ZCC_InitOperators::BinaryOpInit[9].Rtype = (PType **)&TypeSInt32;
      ZCC_InitOperators::BinaryOpInit[9].EvalConst =
           ZCC_InitOperators()::$_20::operator_cast_to_function_pointer(&local_2a);
      ZCC_InitOperators::BinaryOpInit[10].Op = PEX_Div;
      ZCC_InitOperators::BinaryOpInit[10].Res = (PType **)&TypeUInt32;
      ZCC_InitOperators::BinaryOpInit[10].Ltype = (PType **)&TypeUInt32;
      ZCC_InitOperators::BinaryOpInit[10].Rtype = (PType **)&TypeUInt32;
      ZCC_InitOperators::BinaryOpInit[10].EvalConst =
           ZCC_InitOperators()::$_21::operator_cast_to_function_pointer(&local_2b);
      ZCC_InitOperators::BinaryOpInit[0xb].Op = PEX_Div;
      ZCC_InitOperators::BinaryOpInit[0xb].Res = (PType **)&TypeFloat64;
      ZCC_InitOperators::BinaryOpInit[0xb].Ltype = (PType **)&TypeFloat64;
      ZCC_InitOperators::BinaryOpInit[0xb].Rtype = (PType **)&TypeFloat64;
      ZCC_InitOperators::BinaryOpInit[0xb].EvalConst =
           ZCC_InitOperators()::$_22::operator_cast_to_function_pointer(&local_2c);
      ZCC_InitOperators::BinaryOpInit[0xc].Op = PEX_Mod;
      ZCC_InitOperators::BinaryOpInit[0xc].Res = (PType **)&TypeSInt32;
      ZCC_InitOperators::BinaryOpInit[0xc].Ltype = (PType **)&TypeSInt32;
      ZCC_InitOperators::BinaryOpInit[0xc].Rtype = (PType **)&TypeSInt32;
      ZCC_InitOperators::BinaryOpInit[0xc].EvalConst =
           ZCC_InitOperators()::$_23::operator_cast_to_function_pointer(&local_2d);
      ZCC_InitOperators::BinaryOpInit[0xd].Op = PEX_Mod;
      ZCC_InitOperators::BinaryOpInit[0xd].Res = (PType **)&TypeUInt32;
      ZCC_InitOperators::BinaryOpInit[0xd].Ltype = (PType **)&TypeUInt32;
      ZCC_InitOperators::BinaryOpInit[0xd].Rtype = (PType **)&TypeUInt32;
      ZCC_InitOperators::BinaryOpInit[0xd].EvalConst =
           ZCC_InitOperators()::$_24::operator_cast_to_function_pointer(&local_2e);
      ZCC_InitOperators::BinaryOpInit[0xe].Op = PEX_Mod;
      ZCC_InitOperators::BinaryOpInit[0xe].Res = (PType **)&TypeFloat64;
      ZCC_InitOperators::BinaryOpInit[0xe].Ltype = (PType **)&TypeFloat64;
      ZCC_InitOperators::BinaryOpInit[0xe].Rtype = (PType **)&TypeFloat64;
      ZCC_InitOperators::BinaryOpInit[0xe].EvalConst =
           ZCC_InitOperators()::$_25::operator_cast_to_function_pointer(&local_2f);
      ZCC_InitOperators::BinaryOpInit[0xf].Op = PEX_Pow;
      ZCC_InitOperators::BinaryOpInit[0xf].Res = (PType **)&TypeFloat64;
      ZCC_InitOperators::BinaryOpInit[0xf].Ltype = (PType **)&TypeFloat64;
      ZCC_InitOperators::BinaryOpInit[0xf].Rtype = (PType **)&TypeFloat64;
      ZCC_InitOperators::BinaryOpInit[0xf].EvalConst =
           ZCC_InitOperators()::$_26::operator_cast_to_function_pointer(&local_30);
      ZCC_InitOperators::BinaryOpInit[0x10].Op = PEX_Concat;
      ZCC_InitOperators::BinaryOpInit[0x10].Res = (PType **)&TypeString;
      ZCC_InitOperators::BinaryOpInit[0x10].Ltype = (PType **)&TypeString;
      ZCC_InitOperators::BinaryOpInit[0x10].Rtype = (PType **)&TypeString;
      ZCC_InitOperators::BinaryOpInit[0x10].EvalConst = EvalConcat;
      ZCC_InitOperators::BinaryOpInit[0x11].Op = PEX_BitAnd;
      ZCC_InitOperators::BinaryOpInit[0x11].Res = (PType **)&TypeSInt32;
      ZCC_InitOperators::BinaryOpInit[0x11].Ltype = (PType **)&TypeSInt32;
      ZCC_InitOperators::BinaryOpInit[0x11].Rtype = (PType **)&TypeSInt32;
      ZCC_InitOperators::BinaryOpInit[0x11].EvalConst =
           ZCC_InitOperators()::$_27::operator_cast_to_function_pointer(&local_31);
      ZCC_InitOperators::BinaryOpInit[0x12].Op = PEX_BitAnd;
      ZCC_InitOperators::BinaryOpInit[0x12].Res = (PType **)&TypeUInt32;
      ZCC_InitOperators::BinaryOpInit[0x12].Ltype = (PType **)&TypeUInt32;
      ZCC_InitOperators::BinaryOpInit[0x12].Rtype = (PType **)&TypeUInt32;
      ZCC_InitOperators::BinaryOpInit[0x12].EvalConst =
           ZCC_InitOperators()::$_28::operator_cast_to_function_pointer(&local_32);
      ZCC_InitOperators::BinaryOpInit[0x13].Op = PEX_BitOr;
      ZCC_InitOperators::BinaryOpInit[0x13].Res = (PType **)&TypeSInt32;
      ZCC_InitOperators::BinaryOpInit[0x13].Ltype = (PType **)&TypeSInt32;
      ZCC_InitOperators::BinaryOpInit[0x13].Rtype = (PType **)&TypeSInt32;
      ZCC_InitOperators::BinaryOpInit[0x13].EvalConst =
           ZCC_InitOperators()::$_29::operator_cast_to_function_pointer(&local_33);
      ZCC_InitOperators::BinaryOpInit[0x14].Op = PEX_BitOr;
      ZCC_InitOperators::BinaryOpInit[0x14].Res = (PType **)&TypeUInt32;
      ZCC_InitOperators::BinaryOpInit[0x14].Ltype = (PType **)&TypeUInt32;
      ZCC_InitOperators::BinaryOpInit[0x14].Rtype = (PType **)&TypeUInt32;
      ZCC_InitOperators::BinaryOpInit[0x14].EvalConst =
           ZCC_InitOperators()::$_30::operator_cast_to_function_pointer(&local_34);
      ZCC_InitOperators::BinaryOpInit[0x15].Op = PEX_BitXor;
      ZCC_InitOperators::BinaryOpInit[0x15].Res = (PType **)&TypeSInt32;
      ZCC_InitOperators::BinaryOpInit[0x15].Ltype = (PType **)&TypeSInt32;
      ZCC_InitOperators::BinaryOpInit[0x15].Rtype = (PType **)&TypeSInt32;
      ZCC_InitOperators::BinaryOpInit[0x15].EvalConst =
           ZCC_InitOperators()::$_31::operator_cast_to_function_pointer(&local_35);
      ZCC_InitOperators::BinaryOpInit[0x16].Op = PEX_BitXor;
      ZCC_InitOperators::BinaryOpInit[0x16].Res = (PType **)&TypeUInt32;
      ZCC_InitOperators::BinaryOpInit[0x16].Ltype = (PType **)&TypeUInt32;
      ZCC_InitOperators::BinaryOpInit[0x16].Rtype = (PType **)&TypeUInt32;
      ZCC_InitOperators::BinaryOpInit[0x16].EvalConst =
           ZCC_InitOperators()::$_32::operator_cast_to_function_pointer(&local_36);
      ZCC_InitOperators::BinaryOpInit[0x17].Op = PEX_BoolAnd;
      ZCC_InitOperators::BinaryOpInit[0x17].Res = (PType **)&TypeSInt32;
      ZCC_InitOperators::BinaryOpInit[0x17].Ltype = (PType **)&TypeSInt32;
      ZCC_InitOperators::BinaryOpInit[0x17].Rtype = (PType **)&TypeSInt32;
      ZCC_InitOperators::BinaryOpInit[0x17].EvalConst =
           ZCC_InitOperators()::$_33::operator_cast_to_function_pointer(&local_37);
      ZCC_InitOperators::BinaryOpInit[0x18].Op = PEX_BoolAnd;
      ZCC_InitOperators::BinaryOpInit[0x18].Res = (PType **)&TypeUInt32;
      ZCC_InitOperators::BinaryOpInit[0x18].Ltype = (PType **)&TypeUInt32;
      ZCC_InitOperators::BinaryOpInit[0x18].Rtype = (PType **)&TypeUInt32;
      ZCC_InitOperators::BinaryOpInit[0x18].EvalConst =
           ZCC_InitOperators()::$_34::operator_cast_to_function_pointer(&local_38);
      ZCC_InitOperators::BinaryOpInit[0x19].Op = PEX_BoolOr;
      ZCC_InitOperators::BinaryOpInit[0x19].Res = (PType **)&TypeSInt32;
      ZCC_InitOperators::BinaryOpInit[0x19].Ltype = (PType **)&TypeSInt32;
      ZCC_InitOperators::BinaryOpInit[0x19].Rtype = (PType **)&TypeSInt32;
      ZCC_InitOperators::BinaryOpInit[0x19].EvalConst =
           ZCC_InitOperators()::$_35::operator_cast_to_function_pointer(&local_39);
      ZCC_InitOperators::BinaryOpInit[0x1a].Op = PEX_BoolOr;
      ZCC_InitOperators::BinaryOpInit[0x1a].Res = (PType **)&TypeUInt32;
      ZCC_InitOperators::BinaryOpInit[0x1a].Ltype = (PType **)&TypeUInt32;
      ZCC_InitOperators::BinaryOpInit[0x1a].Rtype = (PType **)&TypeUInt32;
      ZCC_InitOperators::BinaryOpInit[0x1a].EvalConst =
           ZCC_InitOperators()::$_36::operator_cast_to_function_pointer(&local_3a);
      ZCC_InitOperators::BinaryOpInit[0x1b].Op = PEX_LeftShift;
      ZCC_InitOperators::BinaryOpInit[0x1b].Res = (PType **)&TypeSInt32;
      ZCC_InitOperators::BinaryOpInit[0x1b].Ltype = (PType **)&TypeSInt32;
      ZCC_InitOperators::BinaryOpInit[0x1b].Rtype = (PType **)&TypeUInt32;
      ZCC_InitOperators::BinaryOpInit[0x1b].EvalConst =
           ZCC_InitOperators()::$_37::operator_cast_to_function_pointer(&local_3b);
      ZCC_InitOperators::BinaryOpInit[0x1c].Op = PEX_LeftShift;
      ZCC_InitOperators::BinaryOpInit[0x1c].Res = (PType **)&TypeUInt32;
      ZCC_InitOperators::BinaryOpInit[0x1c].Ltype = (PType **)&TypeUInt32;
      ZCC_InitOperators::BinaryOpInit[0x1c].Rtype = (PType **)&TypeUInt32;
      ZCC_InitOperators::BinaryOpInit[0x1c].EvalConst =
           ZCC_InitOperators()::$_38::operator_cast_to_function_pointer(&local_3c);
      ZCC_InitOperators::BinaryOpInit[0x1d].Op = PEX_RightShift;
      ZCC_InitOperators::BinaryOpInit[0x1d].Res = (PType **)&TypeSInt32;
      ZCC_InitOperators::BinaryOpInit[0x1d].Ltype = (PType **)&TypeSInt32;
      ZCC_InitOperators::BinaryOpInit[0x1d].Rtype = (PType **)&TypeUInt32;
      ZCC_InitOperators::BinaryOpInit[0x1d].EvalConst =
           ZCC_InitOperators()::$_39::operator_cast_to_function_pointer(&local_3d);
      ZCC_InitOperators::BinaryOpInit[0x1e].Op = PEX_RightShift;
      ZCC_InitOperators::BinaryOpInit[0x1e].Res = (PType **)&TypeUInt32;
      ZCC_InitOperators::BinaryOpInit[0x1e].Ltype = (PType **)&TypeUInt32;
      ZCC_InitOperators::BinaryOpInit[0x1e].Rtype = (PType **)&TypeUInt32;
      ZCC_InitOperators::BinaryOpInit[0x1e].EvalConst =
           ZCC_InitOperators()::$_40::operator_cast_to_function_pointer(&local_3e);
      ZCC_InitOperators::BinaryOpInit[0x1f].Op = PEX_LT;
      ZCC_InitOperators::BinaryOpInit[0x1f].Res = (PType **)&TypeBool;
      ZCC_InitOperators::BinaryOpInit[0x1f].Ltype = (PType **)&TypeSInt32;
      ZCC_InitOperators::BinaryOpInit[0x1f].Rtype = (PType **)&TypeSInt32;
      ZCC_InitOperators::BinaryOpInit[0x1f].EvalConst =
           ZCC_InitOperators()::$_41::operator_cast_to_function_pointer(&local_3f);
      ZCC_InitOperators::BinaryOpInit[0x20].Op = PEX_LT;
      ZCC_InitOperators::BinaryOpInit[0x20].Res = (PType **)&TypeBool;
      ZCC_InitOperators::BinaryOpInit[0x20].Ltype = (PType **)&TypeUInt32;
      ZCC_InitOperators::BinaryOpInit[0x20].Rtype = (PType **)&TypeUInt32;
      ZCC_InitOperators::BinaryOpInit[0x20].EvalConst =
           ZCC_InitOperators()::$_42::operator_cast_to_function_pointer(&local_40);
      ZCC_InitOperators::BinaryOpInit[0x21].Op = PEX_LT;
      ZCC_InitOperators::BinaryOpInit[0x21].Res = (PType **)&TypeBool;
      ZCC_InitOperators::BinaryOpInit[0x21].Ltype = (PType **)&TypeFloat64;
      ZCC_InitOperators::BinaryOpInit[0x21].Rtype = (PType **)&TypeFloat64;
      ZCC_InitOperators::BinaryOpInit[0x21].EvalConst =
           ZCC_InitOperators()::$_43::operator_cast_to_function_pointer(&local_41);
      ZCC_InitOperators::BinaryOpInit[0x22].Op = PEX_LTEQ;
      ZCC_InitOperators::BinaryOpInit[0x22].Res = (PType **)&TypeBool;
      ZCC_InitOperators::BinaryOpInit[0x22].Ltype = (PType **)&TypeSInt32;
      ZCC_InitOperators::BinaryOpInit[0x22].Rtype = (PType **)&TypeSInt32;
      ZCC_InitOperators::BinaryOpInit[0x22].EvalConst =
           ZCC_InitOperators()::$_44::operator_cast_to_function_pointer(&local_42);
      ZCC_InitOperators::BinaryOpInit[0x23].Op = PEX_LTEQ;
      ZCC_InitOperators::BinaryOpInit[0x23].Res = (PType **)&TypeBool;
      ZCC_InitOperators::BinaryOpInit[0x23].Ltype = (PType **)&TypeUInt32;
      ZCC_InitOperators::BinaryOpInit[0x23].Rtype = (PType **)&TypeUInt32;
      ZCC_InitOperators::BinaryOpInit[0x23].EvalConst =
           ZCC_InitOperators()::$_45::operator_cast_to_function_pointer(&local_43);
      ZCC_InitOperators::BinaryOpInit[0x24].Op = PEX_LTEQ;
      ZCC_InitOperators::BinaryOpInit[0x24].Res = (PType **)&TypeBool;
      ZCC_InitOperators::BinaryOpInit[0x24].Ltype = (PType **)&TypeFloat64;
      ZCC_InitOperators::BinaryOpInit[0x24].Rtype = (PType **)&TypeFloat64;
      ZCC_InitOperators::BinaryOpInit[0x24].EvalConst =
           ZCC_InitOperators()::$_46::operator_cast_to_function_pointer(&local_44);
      ZCC_InitOperators::BinaryOpInit[0x25].Op = PEX_GT;
      ZCC_InitOperators::BinaryOpInit[0x25].Res = (PType **)&TypeBool;
      ZCC_InitOperators::BinaryOpInit[0x25].Ltype = (PType **)&TypeSInt32;
      ZCC_InitOperators::BinaryOpInit[0x25].Rtype = (PType **)&TypeSInt32;
      ZCC_InitOperators::BinaryOpInit[0x25].EvalConst =
           ZCC_InitOperators()::$_47::operator_cast_to_function_pointer(&local_45);
      ZCC_InitOperators::BinaryOpInit[0x26].Op = PEX_GT;
      ZCC_InitOperators::BinaryOpInit[0x26].Res = (PType **)&TypeBool;
      ZCC_InitOperators::BinaryOpInit[0x26].Ltype = (PType **)&TypeUInt32;
      ZCC_InitOperators::BinaryOpInit[0x26].Rtype = (PType **)&TypeUInt32;
      ZCC_InitOperators::BinaryOpInit[0x26].EvalConst =
           ZCC_InitOperators()::$_48::operator_cast_to_function_pointer(&local_46);
      ZCC_InitOperators::BinaryOpInit[0x27].Op = PEX_GT;
      ZCC_InitOperators::BinaryOpInit[0x27].Res = (PType **)&TypeBool;
      ZCC_InitOperators::BinaryOpInit[0x27].Ltype = (PType **)&TypeFloat64;
      ZCC_InitOperators::BinaryOpInit[0x27].Rtype = (PType **)&TypeFloat64;
      ZCC_InitOperators::BinaryOpInit[0x27].EvalConst =
           ZCC_InitOperators()::$_49::operator_cast_to_function_pointer(&local_47);
      ZCC_InitOperators::BinaryOpInit[0x28].Op = PEX_GTEQ;
      ZCC_InitOperators::BinaryOpInit[0x28].Res = (PType **)&TypeBool;
      ZCC_InitOperators::BinaryOpInit[0x28].Ltype = (PType **)&TypeSInt32;
      ZCC_InitOperators::BinaryOpInit[0x28].Rtype = (PType **)&TypeSInt32;
      ZCC_InitOperators::BinaryOpInit[0x28].EvalConst =
           ZCC_InitOperators()::$_50::operator_cast_to_function_pointer(&local_48);
      ZCC_InitOperators::BinaryOpInit[0x29].Op = PEX_GTEQ;
      ZCC_InitOperators::BinaryOpInit[0x29].Res = (PType **)&TypeBool;
      ZCC_InitOperators::BinaryOpInit[0x29].Ltype = (PType **)&TypeUInt32;
      ZCC_InitOperators::BinaryOpInit[0x29].Rtype = (PType **)&TypeUInt32;
      ZCC_InitOperators::BinaryOpInit[0x29].EvalConst =
           ZCC_InitOperators()::$_51::operator_cast_to_function_pointer((__51 *)((long)&i_1 + 7));
      ZCC_InitOperators::BinaryOpInit[0x2a].Op = PEX_GTEQ;
      ZCC_InitOperators::BinaryOpInit[0x2a].Res = (PType **)&TypeBool;
      ZCC_InitOperators::BinaryOpInit[0x2a].Ltype = (PType **)&TypeFloat64;
      ZCC_InitOperators::BinaryOpInit[0x2a].Rtype = (PType **)&TypeFloat64;
      ZCC_InitOperators::BinaryOpInit[0x2a].EvalConst =
           ZCC_InitOperators()::$_52::operator_cast_to_function_pointer((__52 *)((long)&i_1 + 6));
      ZCC_InitOperators::BinaryOpInit[0x2b].Op = PEX_NEQ;
      ZCC_InitOperators::BinaryOpInit[0x2b].Res = (PType **)&TypeBool;
      ZCC_InitOperators::BinaryOpInit[0x2b].Ltype = (PType **)&TypeSInt32;
      ZCC_InitOperators::BinaryOpInit[0x2b].Rtype = (PType **)&TypeSInt32;
      ZCC_InitOperators::BinaryOpInit[0x2b].EvalConst =
           ZCC_InitOperators()::$_53::operator_cast_to_function_pointer((__53 *)((long)&i_1 + 5));
      ZCC_InitOperators::BinaryOpInit[0x2c].Op = PEX_NEQ;
      ZCC_InitOperators::BinaryOpInit[0x2c].Res = (PType **)&TypeBool;
      ZCC_InitOperators::BinaryOpInit[0x2c].Ltype = (PType **)&TypeUInt32;
      ZCC_InitOperators::BinaryOpInit[0x2c].Rtype = (PType **)&TypeUInt32;
      ZCC_InitOperators::BinaryOpInit[0x2c].EvalConst =
           ZCC_InitOperators()::$_54::operator_cast_to_function_pointer((__54 *)((long)&i_1 + 4));
      ZCC_InitOperators::BinaryOpInit[0x2d].Op = PEX_NEQ;
      ZCC_InitOperators::BinaryOpInit[0x2d].Res = (PType **)&TypeBool;
      ZCC_InitOperators::BinaryOpInit[0x2d].Ltype = (PType **)&TypeFloat64;
      ZCC_InitOperators::BinaryOpInit[0x2d].Rtype = (PType **)&TypeFloat64;
      ZCC_InitOperators::BinaryOpInit[0x2d].EvalConst =
           ZCC_InitOperators()::$_55::operator_cast_to_function_pointer((__55 *)((long)&i_1 + 3));
      ZCC_InitOperators::BinaryOpInit[0x2e].Op = PEX_EQEQ;
      ZCC_InitOperators::BinaryOpInit[0x2e].Res = (PType **)&TypeBool;
      ZCC_InitOperators::BinaryOpInit[0x2e].Ltype = (PType **)&TypeSInt32;
      ZCC_InitOperators::BinaryOpInit[0x2e].Rtype = (PType **)&TypeSInt32;
      ZCC_InitOperators::BinaryOpInit[0x2e].EvalConst =
           ZCC_InitOperators()::$_56::operator_cast_to_function_pointer((__56 *)((long)&i_1 + 2));
      ZCC_InitOperators::BinaryOpInit[0x2f].Op = PEX_EQEQ;
      ZCC_InitOperators::BinaryOpInit[0x2f].Res = (PType **)&TypeBool;
      ZCC_InitOperators::BinaryOpInit[0x2f].Ltype = (PType **)&TypeUInt32;
      ZCC_InitOperators::BinaryOpInit[0x2f].Rtype = (PType **)&TypeUInt32;
      ZCC_InitOperators::BinaryOpInit[0x2f].EvalConst =
           ZCC_InitOperators()::$_57::operator_cast_to_function_pointer((__57 *)((long)&i_1 + 1));
      ZCC_InitOperators::BinaryOpInit[0x30].Op = PEX_EQEQ;
      ZCC_InitOperators::BinaryOpInit[0x30].Res = (PType **)&TypeBool;
      ZCC_InitOperators::BinaryOpInit[0x30].Ltype = (PType **)&TypeFloat64;
      ZCC_InitOperators::BinaryOpInit[0x30].Rtype = (PType **)&TypeFloat64;
      ZCC_InitOperators::BinaryOpInit[0x30].EvalConst =
           ZCC_InitOperators()::$_58::operator_cast_to_function_pointer((__58 *)&i_1);
      ZCC_InitOperators::BinaryOpInit[0x31].Op = PEX_LTGTEQ;
      ZCC_InitOperators::BinaryOpInit[0x31].Res = (PType **)&TypeSInt32;
      ZCC_InitOperators::BinaryOpInit[0x31].Ltype = (PType **)&TypeSInt32;
      ZCC_InitOperators::BinaryOpInit[0x31].Rtype = (PType **)&TypeSInt32;
      ZCC_InitOperators::BinaryOpInit[0x31].EvalConst = EvalLTGTEQSInt32;
      ZCC_InitOperators::BinaryOpInit[0x32].Op = PEX_LTGTEQ;
      ZCC_InitOperators::BinaryOpInit[0x32].Res = (PType **)&TypeSInt32;
      ZCC_InitOperators::BinaryOpInit[0x32].Ltype = (PType **)&TypeUInt32;
      ZCC_InitOperators::BinaryOpInit[0x32].Rtype = (PType **)&TypeUInt32;
      ZCC_InitOperators::BinaryOpInit[0x32].EvalConst = EvalLTGTEQUInt32;
      ZCC_InitOperators::BinaryOpInit[0x33].Op = PEX_LTGTEQ;
      ZCC_InitOperators::BinaryOpInit[0x33].Res = (PType **)&TypeSInt32;
      ZCC_InitOperators::BinaryOpInit[0x33].Ltype = (PType **)&TypeFloat64;
      ZCC_InitOperators::BinaryOpInit[0x33].Rtype = (PType **)&TypeFloat64;
      ZCC_InitOperators::BinaryOpInit[0x33].EvalConst = EvalLTGTEQFloat64;
      __cxa_guard_release(&ZCC_InitOperators()::BinaryOpInit);
    }
  }
  for (local_58 = 0; local_58 < 0x34; local_58 = local_58 + 1) {
    ZCC_OpInfoType::AddProto
              (ZCC_OpInfo + ZCC_InitOperators::BinaryOpInit[local_58].Op,
               *ZCC_InitOperators::BinaryOpInit[local_58].Res,
               *ZCC_InitOperators::BinaryOpInit[local_58].Ltype,
               *ZCC_InitOperators::BinaryOpInit[local_58].Rtype,
               ZCC_InitOperators::BinaryOpInit[local_58].EvalConst);
  }
  return;
}

Assistant:

void ZCC_InitOperators()
{
	// Prototypes are added from lowest to highest conversion precedence.

	// Unary operators
	static const OpProto1 UnaryOpInit[] =
	{
		{ PEX_PostInc	 , (PType **)&TypeSInt32,  EvalIdentity },
		{ PEX_PostInc	 , (PType **)&TypeUInt32,  EvalIdentity },
		{ PEX_PostInc	 , (PType **)&TypeFloat64, EvalIdentity },

		{ PEX_PostDec	 , (PType **)&TypeSInt32,  EvalIdentity },
		{ PEX_PostDec	 , (PType **)&TypeUInt32,  EvalIdentity },
		{ PEX_PostDec	 , (PType **)&TypeFloat64, EvalIdentity },

		{ PEX_PreInc	 , (PType **)&TypeSInt32,  [](auto *val) { val->IntVal += 1; return val; } },
		{ PEX_PreInc	 , (PType **)&TypeUInt32,  [](auto *val) { val->UIntVal += 1; return val; } },
		{ PEX_PreInc	 , (PType **)&TypeFloat64, [](auto *val) { val->DoubleVal += 1; return val; } },

		{ PEX_PreDec	 , (PType **)&TypeSInt32,  [](auto *val) { val->IntVal -= 1; return val; } },
		{ PEX_PreDec	 , (PType **)&TypeUInt32,  [](auto *val) { val->UIntVal -= 1; return val; } },
		{ PEX_PreDec	 , (PType **)&TypeFloat64, [](auto *val) { val->DoubleVal -= 1; return val; } },

		{ PEX_Negate	 , (PType **)&TypeSInt32,  [](auto *val) { val->IntVal = -val->IntVal; return val; } },
		{ PEX_Negate	 , (PType **)&TypeFloat64, [](auto *val) { val->DoubleVal = -val->DoubleVal; return val; } },

		{ PEX_AntiNegate , (PType **)&TypeSInt32,  EvalIdentity },
		{ PEX_AntiNegate , (PType **)&TypeUInt32,  EvalIdentity },
		{ PEX_AntiNegate , (PType **)&TypeFloat64, EvalIdentity },

		{ PEX_BitNot	 , (PType **)&TypeSInt32,  [](auto *val) { val->IntVal = ~val->IntVal; return val; } },
		{ PEX_BitNot	 , (PType **)&TypeUInt32,  [](auto *val) { val->UIntVal = ~val->UIntVal; return val; } },

		{ PEX_BoolNot	 , (PType **)&TypeBool,    [](auto *val) { val->IntVal = !val->IntVal; return val; } },
	};
	for (size_t i = 0; i < countof(UnaryOpInit); ++i)
	{
		ZCC_OpInfo[UnaryOpInit[i].Op].AddProto(*UnaryOpInit[i].Type, *UnaryOpInit[i].Type, UnaryOpInit[i].EvalConst);
	}

	// Binary operators
	static const OpProto2 BinaryOpInit[] =
	{
		{ PEX_Add		 , (PType **)&TypeSInt32,  (PType **)&TypeSInt32,  (PType **)&TypeSInt32,  [](auto *l, auto *r, auto &) { l->IntVal += r->IntVal; return l; } },
		{ PEX_Add		 , (PType **)&TypeUInt32,  (PType **)&TypeUInt32,  (PType **)&TypeUInt32,  [](auto *l, auto *r, auto &) { l->UIntVal += r->UIntVal; return l; } },
		{ PEX_Add		 , (PType **)&TypeFloat64, (PType **)&TypeFloat64, (PType **)&TypeFloat64, [](auto *l, auto *r, auto &) { l->DoubleVal += r->DoubleVal; return l; } },

		{ PEX_Sub		 , (PType **)&TypeSInt32,  (PType **)&TypeSInt32,  (PType **)&TypeSInt32,  [](auto *l, auto *r, auto &) { l->IntVal -= r->IntVal; return l; } },
		{ PEX_Sub		 , (PType **)&TypeUInt32,  (PType **)&TypeUInt32,  (PType **)&TypeUInt32,  [](auto *l, auto *r, auto &) { l->UIntVal -= r->UIntVal; return l; } },
		{ PEX_Sub		 , (PType **)&TypeFloat64, (PType **)&TypeFloat64, (PType **)&TypeFloat64, [](auto *l, auto *r, auto &) { l->DoubleVal -= r->DoubleVal; return l; } },

		{ PEX_Mul		 , (PType **)&TypeSInt32,  (PType **)&TypeSInt32,  (PType **)&TypeSInt32,  [](auto *l, auto *r, auto &) { l->IntVal *= r->IntVal; return l; } },
		{ PEX_Mul		 , (PType **)&TypeUInt32,  (PType **)&TypeUInt32,  (PType **)&TypeUInt32,  [](auto *l, auto *r, auto &) { l->UIntVal *= r->UIntVal; return l; } },
		{ PEX_Mul		 , (PType **)&TypeFloat64, (PType **)&TypeFloat64, (PType **)&TypeFloat64, [](auto *l, auto *r, auto &) { l->DoubleVal *= r->DoubleVal; return l; } },

		{ PEX_Div		 , (PType **)&TypeSInt32,  (PType **)&TypeSInt32,  (PType **)&TypeSInt32,  [](auto *l, auto *r, auto &) { l->IntVal /= r->IntVal; return l; } },
		{ PEX_Div		 , (PType **)&TypeUInt32,  (PType **)&TypeUInt32,  (PType **)&TypeUInt32,  [](auto *l, auto *r, auto &) { l->UIntVal /= r->UIntVal; return l; } },
		{ PEX_Div		 , (PType **)&TypeFloat64, (PType **)&TypeFloat64, (PType **)&TypeFloat64, [](auto *l, auto *r, auto &) { l->DoubleVal /= r->DoubleVal; return l; } },

		{ PEX_Mod		 , (PType **)&TypeSInt32,  (PType **)&TypeSInt32,  (PType **)&TypeSInt32,  [](auto *l, auto *r, auto &) { l->IntVal %= r->IntVal; return l; } },
		{ PEX_Mod		 , (PType **)&TypeUInt32,  (PType **)&TypeUInt32,  (PType **)&TypeUInt32,  [](auto *l, auto *r, auto &) { l->UIntVal %= r->UIntVal; return l; } },
		{ PEX_Mod		 , (PType **)&TypeFloat64, (PType **)&TypeFloat64, (PType **)&TypeFloat64, [](auto *l, auto *r, auto &) { l->DoubleVal = luai_nummod(l->DoubleVal, r->DoubleVal); return l; } },

		{ PEX_Pow		 , (PType **)&TypeFloat64, (PType **)&TypeFloat64, (PType **)&TypeFloat64, [](auto *l, auto *r, auto &) { l->DoubleVal = g_pow(l->DoubleVal, r->DoubleVal); return l; } },

		{ PEX_Concat	 , (PType **)&TypeString,  (PType **)&TypeString,  (PType **)&TypeString,  EvalConcat },

		{ PEX_BitAnd	 , (PType **)&TypeSInt32,  (PType **)&TypeSInt32,  (PType **)&TypeSInt32,  [](auto *l, auto *r, auto &) { l->IntVal &= r->IntVal; return l; } },
		{ PEX_BitAnd	 , (PType **)&TypeUInt32,  (PType **)&TypeUInt32,  (PType **)&TypeUInt32,  [](auto *l, auto *r, auto &) { l->UIntVal &= r->UIntVal; return l; } },

		{ PEX_BitOr		 , (PType **)&TypeSInt32,  (PType **)&TypeSInt32,  (PType **)&TypeSInt32,  [](auto *l, auto *r, auto &) { l->IntVal |= r->IntVal; return l; } },
		{ PEX_BitOr		 , (PType **)&TypeUInt32,  (PType **)&TypeUInt32,  (PType **)&TypeUInt32,  [](auto *l, auto *r, auto &) { l->UIntVal |= r->UIntVal; return l; } },

		{ PEX_BitXor	 , (PType **)&TypeSInt32,  (PType **)&TypeSInt32,  (PType **)&TypeSInt32,  [](auto *l, auto *r, auto &) { l->IntVal ^= r->IntVal; return l; } },
		{ PEX_BitXor	 , (PType **)&TypeUInt32,  (PType **)&TypeUInt32,  (PType **)&TypeUInt32,  [](auto *l, auto *r, auto &) { l->UIntVal ^= r->UIntVal; return l; } },

		{ PEX_BoolAnd	 , (PType **)&TypeSInt32,  (PType **)&TypeSInt32,  (PType **)&TypeSInt32,  [](auto *l, auto *r, auto &) { l->IntVal = l->IntVal && r->IntVal; l->Type = TypeBool; return l; } },
		{ PEX_BoolAnd	 , (PType **)&TypeUInt32,  (PType **)&TypeUInt32,  (PType **)&TypeUInt32,  [](auto *l, auto *r, auto &) { l->IntVal = l->UIntVal && r->UIntVal; l->Type = TypeBool; return l;  } },

		{ PEX_BoolOr	 , (PType **)&TypeSInt32,  (PType **)&TypeSInt32,  (PType **)&TypeSInt32,  [](auto *l, auto *r, auto &) { l->IntVal = l->IntVal || r->IntVal; l->Type = TypeBool; return l; } },
		{ PEX_BoolOr	 , (PType **)&TypeUInt32,  (PType **)&TypeUInt32,  (PType **)&TypeUInt32,  [](auto *l, auto *r, auto &) { l->IntVal = l->UIntVal || r->UIntVal; l->Type = TypeBool; return l; } },

		{ PEX_LeftShift  , (PType **)&TypeSInt32,  (PType **)&TypeSInt32,  (PType **)&TypeUInt32,  [](auto *l, auto *r, auto &) { l->IntVal <<= r->UIntVal; return l; } },
		{ PEX_LeftShift  , (PType **)&TypeUInt32,  (PType **)&TypeUInt32,  (PType **)&TypeUInt32,  [](auto *l, auto *r, auto &) { l->UIntVal <<= r->UIntVal; return l; } },

		{ PEX_RightShift , (PType **)&TypeSInt32,  (PType **)&TypeSInt32,  (PType **)&TypeUInt32,  [](auto *l, auto *r, auto &) { l->IntVal >>= r->UIntVal; return l; } },
		{ PEX_RightShift , (PType **)&TypeUInt32,  (PType **)&TypeUInt32,  (PType **)&TypeUInt32,  [](auto *l, auto *r, auto &) { l->UIntVal >>= r->UIntVal; return l; } },

		{ PEX_LT		 , (PType **)&TypeBool,    (PType **)&TypeSInt32,  (PType **)&TypeSInt32,  [](auto *l, auto *r, auto &) { l->IntVal = l->IntVal < r->IntVal; l->Type = TypeBool; return l; } },
		{ PEX_LT		 , (PType **)&TypeBool,    (PType **)&TypeUInt32,  (PType **)&TypeUInt32,  [](auto *l, auto *r, auto &) { l->IntVal = l->UIntVal < r->UIntVal; l->Type = TypeBool; return l; } },
		{ PEX_LT		 , (PType **)&TypeBool,    (PType **)&TypeFloat64, (PType **)&TypeFloat64, [](auto *l, auto *r, auto &) { l->IntVal = l->DoubleVal < r->DoubleVal; l->Type = TypeBool; return l; } },

		{ PEX_LTEQ		 , (PType **)&TypeBool,    (PType **)&TypeSInt32,  (PType **)&TypeSInt32,  [](auto *l, auto *r, auto &) { l->IntVal = l->IntVal <= r->IntVal; l->Type = TypeBool; return l; } },
		{ PEX_LTEQ		 , (PType **)&TypeBool,    (PType **)&TypeUInt32,  (PType **)&TypeUInt32,  [](auto *l, auto *r, auto &) { l->IntVal = l->UIntVal <= r->UIntVal; l->Type = TypeBool; return l; } },
		{ PEX_LTEQ		 , (PType **)&TypeBool,    (PType **)&TypeFloat64, (PType **)&TypeFloat64, [](auto *l, auto *r, auto &) { l->IntVal = l->DoubleVal <= r->DoubleVal; l->Type = TypeBool; return l; } },

		{ PEX_GT		 , (PType **)&TypeBool,    (PType **)&TypeSInt32,  (PType **)&TypeSInt32,  [](auto *l, auto *r, auto &) { l->IntVal = l->IntVal > r->IntVal; l->Type = TypeBool; return l; } },
		{ PEX_GT		 , (PType **)&TypeBool,    (PType **)&TypeUInt32,  (PType **)&TypeUInt32,  [](auto *l, auto *r, auto &) { l->IntVal = l->UIntVal > r->UIntVal; l->Type = TypeBool; return l; } },
		{ PEX_GT		 , (PType **)&TypeBool,    (PType **)&TypeFloat64, (PType **)&TypeFloat64, [](auto *l, auto *r, auto &) { l->IntVal = l->DoubleVal > r->DoubleVal; l->Type = TypeBool; return l; } },

		{ PEX_GTEQ		 , (PType **)&TypeBool,    (PType **)&TypeSInt32,  (PType **)&TypeSInt32,  [](auto *l, auto *r, auto &) { l->IntVal = l->IntVal >= r->IntVal; l->Type = TypeBool; return l; } },
		{ PEX_GTEQ		 , (PType **)&TypeBool,    (PType **)&TypeUInt32,  (PType **)&TypeUInt32,  [](auto *l, auto *r, auto &) { l->IntVal = l->UIntVal >= r->UIntVal; l->Type = TypeBool; return l; } },
		{ PEX_GTEQ		 , (PType **)&TypeBool,    (PType **)&TypeFloat64, (PType **)&TypeFloat64, [](auto *l, auto *r, auto &) { l->IntVal = l->DoubleVal >= r->DoubleVal; l->Type = TypeBool; return l; } },

		{ PEX_NEQ		 , (PType **)&TypeBool,    (PType **)&TypeSInt32,  (PType **)&TypeSInt32,  [](auto *l, auto *r, auto &) { l->IntVal = l->IntVal != r->IntVal; l->Type = TypeBool; return l; } },
		{ PEX_NEQ		 , (PType **)&TypeBool,    (PType **)&TypeUInt32,  (PType **)&TypeUInt32,  [](auto *l, auto *r, auto &) { l->IntVal = l->UIntVal != r->UIntVal; l->Type = TypeBool; return l; } },
		{ PEX_NEQ		 , (PType **)&TypeBool,    (PType **)&TypeFloat64, (PType **)&TypeFloat64, [](auto *l, auto *r, auto &) { l->IntVal = l->DoubleVal != r->DoubleVal; l->Type = TypeBool; return l; } },

		{ PEX_EQEQ		 , (PType **)&TypeBool,    (PType **)&TypeSInt32,  (PType **)&TypeSInt32,  [](auto *l, auto *r, auto &) { l->IntVal = l->IntVal == r->IntVal; l->Type = TypeBool; return l; } },
		{ PEX_EQEQ		 , (PType **)&TypeBool,    (PType **)&TypeUInt32,  (PType **)&TypeUInt32,  [](auto *l, auto *r, auto &) { l->IntVal = l->UIntVal == r->UIntVal; l->Type = TypeBool; return l; } },
		{ PEX_EQEQ		 , (PType **)&TypeBool,    (PType **)&TypeFloat64, (PType **)&TypeFloat64, [](auto *l, auto *r, auto &) { l->IntVal = l->DoubleVal == r->DoubleVal; l->Type = TypeBool; return l; } },

		{ PEX_LTGTEQ	 , (PType **)&TypeSInt32,  (PType **)&TypeSInt32,  (PType **)&TypeSInt32,  EvalLTGTEQSInt32 },
		{ PEX_LTGTEQ	 , (PType **)&TypeSInt32,  (PType **)&TypeUInt32,  (PType **)&TypeUInt32,  EvalLTGTEQUInt32 },
		{ PEX_LTGTEQ	 , (PType **)&TypeSInt32,  (PType **)&TypeFloat64, (PType **)&TypeFloat64, EvalLTGTEQFloat64 },
	};
	for (size_t i = 0; i < countof(BinaryOpInit); ++i)
	{
		ZCC_OpInfo[BinaryOpInit[i].Op].AddProto(*BinaryOpInit[i].Res, *BinaryOpInit[i].Ltype, *BinaryOpInit[i].Rtype, BinaryOpInit[i].EvalConst);
	}
}